

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# float.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_float64_primitive_parseString
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  _Bool _Var1;
  size_t stringSize;
  sysbvm_tuple_t *arguments_local;
  size_t argumentCount_local;
  sysbvm_tuple_t closure_local;
  sysbvm_context_t *context_local;
  
  if (argumentCount != 2) {
    sysbvm_error_argumentCountMismatch(2,argumentCount);
  }
  _Var1 = sysbvm_tuple_isNonNullPointer(arguments[1]);
  if (_Var1) {
    stringSize = sysbvm_tuple_getSizeInBytes(arguments[1]);
    context_local =
         (sysbvm_context_t *)
         sysbvm_float64_parseString(context,stringSize,(char *)(arguments[1] + 0x10));
  }
  else {
    context_local = (sysbvm_context_t *)sysbvm_tuple_integer_encodeSmall(0);
  }
  return (sysbvm_tuple_t)context_local;
}

Assistant:

static sysbvm_tuple_t sysbvm_float64_primitive_parseString(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)context;
    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);
    if(!sysbvm_tuple_isNonNullPointer(arguments[1])) return sysbvm_tuple_integer_encodeSmall(0);
    return sysbvm_float64_parseString(context, sysbvm_tuple_getSizeInBytes(arguments[1]), (const char *)SYSBVM_CAST_OOP_TO_OBJECT_TUPLE(arguments[1])->bytes);
}